

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O0

void __thiscall QtConcurrent::ThreadEngineBase::acquireBarrierSemaphore(ThreadEngineBase *this)

{
  ThreadEngineBarrier::acquire((ThreadEngineBarrier *)this);
  return;
}

Assistant:

void ThreadEngineBase::acquireBarrierSemaphore()
{
    barrier.acquire();
}